

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void scroll(Terminal *term,wchar_t topline,wchar_t botline,wchar_t lines,_Bool sb)

{
  tree234 *t;
  wchar_t wVar1;
  termline *ptVar2;
  void *ptr;
  compressed_scrollback_line *e;
  wchar_t wVar3;
  
  if ((topline != L'\0') || (term->alt_which != L'\0')) {
    sb = false;
  }
  wVar1 = (botline - topline) + L'\x01';
  if (lines < L'\0') {
    wVar3 = -lines;
    if (SBORROW4(wVar1,-lines) != wVar1 + lines < 0) {
      wVar3 = wVar1;
    }
    for (; L'\0' < wVar3; wVar3 = wVar3 + L'\xffffffff') {
      ptVar2 = (termline *)delpos234(term->screen,botline);
      resizeline(term,ptVar2,term->cols);
      clear_line(term,ptVar2);
      addpos234(term->screen,ptVar2,topline);
      wVar1 = (term->selstart).y;
      if ((wVar1 <= botline && topline <= wVar1) &&
         ((term->selstart).y = wVar1 + L'\x01', botline <= wVar1)) {
        (term->selstart).y = botline + L'\x01';
        (term->selstart).x = L'\0';
      }
      wVar1 = (term->selend).y;
      if ((wVar1 <= botline && topline <= wVar1) &&
         ((term->selend).y = wVar1 + L'\x01', botline <= wVar1)) {
        (term->selend).y = botline + L'\x01';
        (term->selend).x = L'\0';
      }
    }
  }
  else {
    if (wVar1 < lines) {
      lines = wVar1;
    }
    for (; L'\0' < lines; lines = lines + L'\xffffffff') {
      ptVar2 = (termline *)delpos234(term->screen,topline);
      if (sb == false) {
        resizeline(term,ptVar2,term->cols);
        clear_line(term,ptVar2);
        ptVar2->trusted = false;
        addpos234(term->screen,ptVar2,botline);
        wVar1 = topline;
      }
      else {
        if (L'\0' < term->savelines) {
          wVar1 = count234(term->scrollback);
          if (wVar1 == term->savelines) {
            wVar1 = wVar1 + L'\xffffffff';
            ptr = delpos234(term->scrollback,0);
            safefree(ptr);
          }
          else {
            term->tempsblines = term->tempsblines + L'\x01';
          }
          t = term->scrollback;
          e = compressline(ptVar2);
          addpos234(t,e,wVar1);
          wVar1 = term->disptop;
          if ((wVar1 < L'\0') &&
             (wVar3 = -term->savelines,
             wVar1 != wVar3 && SBORROW4(wVar1,wVar3) == wVar1 + term->savelines < 0)) {
            term->disptop = wVar1 + L'\xffffffff';
          }
        }
        resizeline(term,ptVar2,term->cols);
        clear_line(term,ptVar2);
        ptVar2->trusted = false;
        addpos234(term->screen,ptVar2,botline);
        wVar1 = -term->savelines;
      }
      if (term->selstate != LEXICOGRAPHIC) {
        wVar3 = (term->selstart).y;
        if ((wVar3 <= botline && wVar1 <= wVar3) &&
           ((term->selstart).y = wVar3 + L'\xffffffff', wVar3 <= wVar1)) {
          (term->selstart).y = wVar1;
          (term->selstart).x = L'\0';
        }
        wVar3 = (term->selend).y;
        if ((wVar3 <= botline && wVar1 <= wVar3) &&
           ((term->selend).y = wVar3 + L'\xffffffff', wVar3 <= wVar1)) {
          (term->selend).y = wVar1;
          (term->selend).x = L'\0';
        }
        wVar3 = (term->selanchor).y;
        if ((wVar1 <= wVar3 && wVar3 <= botline) &&
           ((term->selanchor).y = wVar3 + L'\xffffffff', wVar3 <= wVar1)) {
          (term->selanchor).y = wVar1;
          (term->selanchor).x = L'\0';
        }
      }
    }
  }
  return;
}

Assistant:

static void scroll(Terminal *term, int topline, int botline,
                   int lines, bool sb)
{
    termline *line;
    int seltop, scrollwinsize;

    if (topline != 0 || term->alt_which != 0)
        sb = false;

    scrollwinsize = botline - topline + 1;

    if (lines < 0) {
        lines = -lines;
        if (lines > scrollwinsize)
            lines = scrollwinsize;
        while (lines-- > 0) {
            line = delpos234(term->screen, botline);
            resizeline(term, line, term->cols);
            clear_line(term, line);
            addpos234(term->screen, line, topline);

            if (term->selstart.y >= topline && term->selstart.y <= botline) {
                term->selstart.y++;
                if (term->selstart.y > botline) {
                    term->selstart.y = botline + 1;
                    term->selstart.x = 0;
                }
            }
            if (term->selend.y >= topline && term->selend.y <= botline) {
                term->selend.y++;
                if (term->selend.y > botline) {
                    term->selend.y = botline + 1;
                    term->selend.x = 0;
                }
            }
        }
    } else {
        if (lines > scrollwinsize)
            lines = scrollwinsize;
        while (lines-- > 0) {
            line = delpos234(term->screen, topline);
#ifdef TERM_CC_DIAGS
            cc_check(line);
#endif
            if (sb && term->savelines > 0) {
                int sblen = count234(term->scrollback);
                /*
                 * We must add this line to the scrollback. We'll
                 * remove a line from the top of the scrollback if
                 * the scrollback is full.
                 */
                if (sblen == term->savelines) {
                    unsigned char *cline;

                    sblen--;
                    cline = delpos234(term->scrollback, 0);
                    sfree(cline);
                } else
                    term->tempsblines += 1;

                addpos234(term->scrollback, compressline(line), sblen);

                /* now `line' itself can be reused as the bottom line */

                /*
                 * If the user is currently looking at part of the
                 * scrollback, and they haven't enabled any options
                 * that are going to reset the scrollback as a
                 * result of this movement, then the chances are
                 * they'd like to keep looking at the same line. So
                 * we move their viewpoint at the same rate as the
                 * scroll, at least until their viewpoint hits the
                 * top end of the scrollback buffer, at which point
                 * we don't have the choice any more.
                 *
                 * Thanks to Jan Holmen Holsten for the idea and
                 * initial implementation.
                 */
                if (term->disptop > -term->savelines && term->disptop < 0)
                    term->disptop--;
            }
            resizeline(term, line, term->cols);
            clear_line(term, line);
            line->trusted = false;
            addpos234(term->screen, line, botline);

            /*
             * If the selection endpoints move into the scrollback,
             * we keep them moving until they hit the top. However,
             * of course, if the line _hasn't_ moved into the
             * scrollback then we don't do this, and cut them off
             * at the top of the scroll region.
             *
             * This applies to selstart and selend (for an existing
             * selection), and also selanchor (for one being
             * selected as we speak).
             */
            seltop = sb ? -term->savelines : topline;

            if (term->selstate != NO_SELECTION) {
                if (term->selstart.y >= seltop &&
                    term->selstart.y <= botline) {
                    term->selstart.y--;
                    if (term->selstart.y < seltop) {
                        term->selstart.y = seltop;
                        term->selstart.x = 0;
                    }
                }
                if (term->selend.y >= seltop && term->selend.y <= botline) {
                    term->selend.y--;
                    if (term->selend.y < seltop) {
                        term->selend.y = seltop;
                        term->selend.x = 0;
                    }
                }
                if (term->selanchor.y >= seltop &&
                    term->selanchor.y <= botline) {
                    term->selanchor.y--;
                    if (term->selanchor.y < seltop) {
                        term->selanchor.y = seltop;
                        term->selanchor.x = 0;
                    }
                }
            }
        }
    }
}